

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::deinit(DrawCallBatchingTest *this)

{
  ShaderProgram *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_128;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_110;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_f8;
  int local_dc;
  undefined1 local_d8 [4];
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  local_90;
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  long local_18;
  Functions *gl;
  DrawCallBatchingTest *this_local;
  
  gl = (Functions *)this;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar3);
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
    operator_delete(this_00,0xd0);
  }
  this->m_program = (ShaderProgram *)0x0;
  memset(&local_30,0,0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->m_dynamicIndexData,&local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_30);
  memset(&local_48,0,0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->m_staticIndexData,&local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_48);
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    (&this->m_unbatchedDynamicIndexBuffers);
  if (!bVar2) {
    pcVar1 = *(code **)(local_18 + 0x438);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&this->m_unbatchedDynamicIndexBuffers);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_unbatchedDynamicIndexBuffers,0);
    (*pcVar1)(sVar5 & 0xffffffff,pvVar6);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x1fd);
    memset(&local_60,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->m_unbatchedDynamicIndexBuffers,&local_60);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_60);
  }
  if (this->m_batchedDynamicIndexBuffer != 0) {
    (**(code **)(local_18 + 0x438))(1,&this->m_batchedDynamicIndexBuffer);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x205);
    this->m_batchedDynamicIndexBuffer = 0;
  }
  if (this->m_unbatchedStaticIndexBuffer != 0) {
    (**(code **)(local_18 + 0x438))(1,&this->m_unbatchedStaticIndexBuffer);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x20d);
    this->m_unbatchedStaticIndexBuffer = 0;
  }
  if (this->m_batchedStaticIndexBuffer != 0) {
    (**(code **)(local_18 + 0x438))(1,&this->m_batchedStaticIndexBuffer);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x215);
    this->m_batchedStaticIndexBuffer = 0;
  }
  memset(&local_78,0,0x18);
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::vector(&local_78);
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::operator=(&this->m_staticAttributeDatas,&local_78);
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::~vector(&local_78);
  memset(&local_90,0,0x18);
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::vector(&local_90);
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::operator=(&this->m_dynamicAttributeDatas,&local_90);
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::~vector(&local_90);
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    (&this->m_batchedStaticBuffers);
  if (!bVar2) {
    pcVar1 = *(code **)(local_18 + 0x438);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&this->m_batchedStaticBuffers);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_batchedStaticBuffers,0);
    (*pcVar1)(sVar5 & 0xffffffff,pvVar6);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x220);
    memset(&local_a8,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_a8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->m_batchedStaticBuffers,&local_a8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_a8);
  }
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    (&this->m_unbatchedStaticBuffers);
  if (!bVar2) {
    pcVar1 = *(code **)(local_18 + 0x438);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&this->m_unbatchedStaticBuffers);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_unbatchedStaticBuffers,0);
    (*pcVar1)(sVar5 & 0xffffffff,pvVar6);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x228);
    memset(&local_c0,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_c0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->m_unbatchedStaticBuffers,&local_c0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_c0);
  }
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    (&this->m_batchedDynamicBuffers);
  if (!bVar2) {
    pcVar1 = *(code **)(local_18 + 0x438);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&this->m_batchedDynamicBuffers);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_batchedDynamicBuffers,0);
    (*pcVar1)(sVar5 & 0xffffffff,pvVar6);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x230);
    memset(local_d8,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->m_batchedDynamicBuffers,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
  }
  local_dc = 0;
  while( true ) {
    iVar3 = local_dc;
    sVar5 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::size(&this->m_unbatchedDynamicBuffers);
    if ((int)sVar5 <= iVar3) break;
    pcVar1 = *(code **)(local_18 + 0x438);
    pvVar7 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](&this->m_unbatchedDynamicBuffers,(long)local_dc);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
    pvVar7 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](&this->m_unbatchedDynamicBuffers,(long)local_dc);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar7,0);
    (*pcVar1)(sVar5 & 0xffffffff,pvVar6);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x238);
    local_dc = local_dc + 1;
  }
  memset(&local_f8,0,0x18);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_f8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator=(&this->m_unbatchedDynamicBuffers,&local_f8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_f8);
  memset(&local_110,0,0x18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_110);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->m_unbatchedSamplesUs,&local_110);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_110);
  memset(&local_128,0,0x18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_128);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->m_batchedSamplesUs,&local_128);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_128);
  return;
}

Assistant:

void DrawCallBatchingTest::deinit (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	delete m_program;
	m_program = NULL;

	m_dynamicIndexData	= vector<deUint8>();
	m_staticIndexData	= vector<deUint8>();

	if (!m_unbatchedDynamicIndexBuffers.empty())
	{
		gl.deleteBuffers((GLsizei)m_unbatchedDynamicIndexBuffers.size(), &(m_unbatchedDynamicIndexBuffers[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers()");

		m_unbatchedDynamicIndexBuffers = vector<GLuint>();
	}

	if (m_batchedDynamicIndexBuffer)
	{
		gl.deleteBuffers((GLsizei)1, &m_batchedDynamicIndexBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers()");

		m_batchedDynamicIndexBuffer = 0;
	}

	if (m_unbatchedStaticIndexBuffer)
	{
		gl.deleteBuffers((GLsizei)1, &m_unbatchedStaticIndexBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers()");

		m_unbatchedStaticIndexBuffer = 0;
	}

	if (m_batchedStaticIndexBuffer)
	{
		gl.deleteBuffers((GLsizei)1, &m_batchedStaticIndexBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers()");

		m_batchedStaticIndexBuffer = 0;
	}

	m_staticAttributeDatas	= vector<vector<deInt8> >();
	m_dynamicAttributeDatas	= vector<vector<deInt8> >();

	if (!m_batchedStaticBuffers.empty())
	{
		gl.deleteBuffers((GLsizei)m_batchedStaticBuffers.size(), &(m_batchedStaticBuffers[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers()");

		m_batchedStaticBuffers = vector<GLuint>();
	}

	if (!m_unbatchedStaticBuffers.empty())
	{
		gl.deleteBuffers((GLsizei)m_unbatchedStaticBuffers.size(), &(m_unbatchedStaticBuffers[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers()");

		m_unbatchedStaticBuffers = vector<GLuint>();
	}

	if (!m_batchedDynamicBuffers.empty())
	{
		gl.deleteBuffers((GLsizei)m_batchedDynamicBuffers.size(), &(m_batchedDynamicBuffers[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers()");

		m_batchedDynamicBuffers = vector<GLuint>();
	}

	for (int i = 0; i < (int)m_unbatchedDynamicBuffers.size(); i++)
	{
		gl.deleteBuffers((GLsizei)m_unbatchedDynamicBuffers[i].size(), &(m_unbatchedDynamicBuffers[i][0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers()");
	}

	m_unbatchedDynamicBuffers = vector<vector<GLuint> >();

	m_unbatchedSamplesUs	= vector<deUint64>();
	m_batchedSamplesUs		= vector<deUint64>();
}